

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_migrate.c
# Opt level: O2

REF_STATUS ref_migrate_native_rcb_part(REF_GRID ref_grid,REF_INT npart,REF_INT *node_part)

{
  REF_MPI ref_mpi;
  REF_NODE pRVar1;
  REF_DBL *pRVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  REF_DBL *xyz;
  REF_INT *owners;
  REF_INT *locals;
  undefined8 uVar7;
  long lVar8;
  char *pcVar9;
  long lVar10;
  int n;
  size_t __size;
  double dVar11;
  REF_DBL psi;
  REF_BOOL in_stack_ffffffffffffff58;
  REF_DBL transform [9];
  
  ref_mpi = ref_grid->mpi;
  pRVar1 = ref_grid->node;
  for (lVar6 = 0; iVar5 = pRVar1->max, lVar6 < iVar5; lVar6 = lVar6 + 1) {
    node_part[lVar6] = -1;
  }
  uVar3 = pRVar1->n;
  if ((int)uVar3 < 0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c",0x237
           ,"ref_migrate_native_rcb_part","malloc xyz of REF_DBL negative");
    return 1;
  }
  xyz = (REF_DBL *)malloc((ulong)uVar3 * 0x18);
  if (xyz == (REF_DBL *)0x0) {
    pcVar9 = "malloc xyz of REF_DBL NULL";
    uVar7 = 0x237;
LAB_001f0c8b:
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c",uVar7
           ,"ref_migrate_native_rcb_part",pcVar9);
    return 2;
  }
  __size = (ulong)uVar3 << 2;
  owners = (REF_INT *)malloc(__size);
  if (owners == (REF_INT *)0x0) {
    pcVar9 = "malloc owners of REF_INT NULL";
    uVar7 = 0x238;
    goto LAB_001f0c8b;
  }
  locals = (REF_INT *)malloc(__size);
  if (locals == (REF_INT *)0x0) {
    pcVar9 = "malloc locals of REF_INT NULL";
    uVar7 = 0x239;
    goto LAB_001f0c8b;
  }
  lVar10 = 0;
  n = 0;
  for (lVar6 = 0; lVar6 < iVar5; lVar6 = lVar6 + 1) {
    if ((-1 < pRVar1->global[lVar6]) && (iVar4 = pRVar1->ref_mpi->id, iVar4 == pRVar1->part[lVar6]))
    {
      pRVar2 = pRVar1->real;
      for (lVar8 = 0; lVar8 != 3; lVar8 = lVar8 + 1) {
        xyz[n * 3 + lVar8] = *(REF_DBL *)((long)pRVar2 + lVar8 * 8 + lVar10);
      }
      owners[n] = iVar4;
      locals[n] = (REF_INT)lVar6;
      n = n + 1;
    }
    lVar10 = lVar10 + 0x78;
  }
  if (ref_mpi->id == 0) {
    iVar5 = ref_grid->twod;
    iVar4 = rand();
    dVar11 = 0.0;
    psi = 0.0;
    if (iVar5 == 0) {
      iVar5 = rand();
      dVar11 = ((double)iVar5 + (double)iVar5) / 2147483647.0 + -1.0;
      if (1.0 <= dVar11) {
        dVar11 = 1.0;
      }
      if (dVar11 <= -1.0) {
        dVar11 = -1.0;
      }
      dVar11 = acos(dVar11);
      iVar5 = rand();
      psi = ((double)iVar5 * 6.28318530717958) / 2147483647.0;
    }
    uVar3 = ref_matrix_euler_rotation
                      (((double)iVar4 * 6.28318530717958) / 2147483647.0,dVar11,psi,transform);
    if (uVar3 != 0) {
      pcVar9 = "rot";
      uVar7 = 0x252;
      goto LAB_001f0d68;
    }
  }
  uVar3 = ref_mpi_bcast(ref_mpi,transform,9,3);
  if (uVar3 == 0) {
    uVar3 = ref_migrate_native_rcb_direction
                      (ref_mpi,n,xyz,transform,npart,0,owners,locals,ref_mpi,node_part,
                       ref_grid->partitioner_seed,-1,in_stack_ffffffffffffff58);
    if (uVar3 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c",
             0x25a,"ref_migrate_native_rcb_part",(ulong)uVar3,"split");
      return uVar3;
    }
    iVar5 = ref_grid->partitioner_seed + 1;
    if (ref_grid->partitioner_seed < -1) {
      iVar5 = 0;
    }
    ref_grid->partitioner_seed = iVar5;
    free(locals);
    free(owners);
    free(xyz);
    ref_mpi_stopwatch_stop(ref_grid->mpi,"native RCB part");
    return 0;
  }
  pcVar9 = "bcast xform";
  uVar7 = 0x254;
LAB_001f0d68:
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c",uVar7,
         "ref_migrate_native_rcb_part",(ulong)uVar3,pcVar9);
  return uVar3;
}

Assistant:

REF_FCN static REF_STATUS ref_migrate_native_rcb_part(REF_GRID ref_grid,
                                                      REF_INT npart,
                                                      REF_INT *node_part) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_MPI ref_mpi = ref_grid_mpi(ref_grid);
  REF_INT node;
  REF_INT i, n;
  REF_DBL *xyz;
  REF_INT offset;
  REF_INT *owners;
  REF_INT *locals;
  REF_DBL transform[9];

  for (node = 0; node < ref_node_max(ref_node); node++)
    node_part[node] = REF_EMPTY;

  offset = 0;

  n = ref_node_n(ref_node);
  ref_malloc(xyz, 3 * n, REF_DBL);
  ref_malloc(owners, n, REF_INT);
  ref_malloc(locals, n, REF_INT);
  n = 0;
  each_ref_node_valid_node(ref_node, node) {
    if (ref_node_owned(ref_node, node)) {
      for (i = 0; i < 3; i++) xyz[i + 3 * n] = ref_node_xyz(ref_node, i, node);
      owners[n] = ref_node_part(ref_node, node);
      locals[n] = node;
      n++;
    }
  }

  if (ref_mpi_once(ref_mpi)) {
    REF_DBL phi, theta, psi, z;
    if (ref_grid_twod(ref_grid)) { /* restrict rotation to x-y plane */
      phi = 2.0 * ref_math_pi * (REF_DBL)(rand()) / (REF_DBL)RAND_MAX;
      theta = 0.0;
      psi = 0.0;
    } else { /* not exactly unirom sampling, should be good enough */
      phi = 2.0 * ref_math_pi * (REF_DBL)(rand()) / (REF_DBL)RAND_MAX;
      z = 2.0 * (REF_DBL)(rand()) / (REF_DBL)RAND_MAX - 1.0;
      z = MAX(MIN(z, 1.0), -1.0); /* redundant nan safety */
      theta = acos(z);
      psi = 2.0 * ref_math_pi * (REF_DBL)(rand()) / (REF_DBL)RAND_MAX;
    }
    /* printf("phi %f theta %f psi %f\n",phi,theta,psi); */
    RSS(ref_matrix_euler_rotation(phi, theta, psi, transform), "rot");
  }
  RSS(ref_mpi_bcast(ref_mpi, transform, 9, REF_DBL_TYPE), "bcast xform");

  RSS(ref_migrate_native_rcb_direction(
          ref_mpi, n, xyz, transform, npart, offset, owners, locals, ref_mpi,
          node_part, ref_grid_partitioner_seed(ref_grid), -1,
          ref_grid_twod(ref_grid)),
      "split");
  ref_grid_partitioner_seed(ref_grid)++;
  if (ref_grid_partitioner_seed(ref_grid) < 0)
    ref_grid_partitioner_seed(ref_grid) = 0; /* overflow int */

  ref_free(locals);
  ref_free(owners);
  ref_free(xyz);

  ref_mpi_stopwatch_stop(ref_grid_mpi(ref_grid), "native RCB part");

  return REF_SUCCESS;
}